

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_ldm_skipSequences(rawSeqStore_t *rawSeqStore,size_t srcSize,U32 minMatch)

{
  int *piVar1;
  ulong uVar2;
  rawSeq *prVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  if (srcSize != 0) {
    uVar4 = rawSeqStore->pos;
    uVar2 = rawSeqStore->size;
    lVar5 = uVar4 * 0xc + 4;
    do {
      if (uVar2 <= uVar4) {
        return;
      }
      prVar3 = rawSeqStore->seq;
      uVar6 = *(uint *)((long)&prVar3->offset + lVar5);
      uVar7 = srcSize - uVar6;
      if (srcSize < uVar6 || uVar7 == 0) {
        *(uint *)((long)&prVar3->offset + lVar5) = uVar6 - (int)srcSize;
        return;
      }
      *(undefined4 *)((long)&prVar3->offset + lVar5) = 0;
      uVar6 = *(uint *)((long)&prVar3->litLength + lVar5);
      if (uVar7 < uVar6) {
        uVar6 = uVar6 - (int)uVar7;
        *(uint *)((long)&prVar3->litLength + lVar5) = uVar6;
        if (minMatch <= uVar6) {
          return;
        }
        if (uVar4 + 1 < uVar2) {
          piVar1 = (int *)((long)&prVar3[1].offset + lVar5);
          *piVar1 = *piVar1 + uVar6;
        }
        rawSeqStore->pos = uVar4 + 1;
        return;
      }
      uVar4 = uVar4 + 1;
      *(undefined4 *)((long)&prVar3->litLength + lVar5) = 0;
      lVar5 = lVar5 + 0xc;
      rawSeqStore->pos = uVar4;
      srcSize = uVar7 - uVar6;
    } while (srcSize != 0);
  }
  return;
}

Assistant:

void ZSTD_ldm_skipSequences(rawSeqStore_t* rawSeqStore, size_t srcSize, U32 const minMatch) {
    while (srcSize > 0 && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq* seq = rawSeqStore->seq + rawSeqStore->pos;
        if (srcSize <= seq->litLength) {
            /* Skip past srcSize literals */
            seq->litLength -= (U32)srcSize;
            return;
        }
        srcSize -= seq->litLength;
        seq->litLength = 0;
        if (srcSize < seq->matchLength) {
            /* Skip past the first srcSize of the match */
            seq->matchLength -= (U32)srcSize;
            if (seq->matchLength < minMatch) {
                /* The match is too short, omit it */
                if (rawSeqStore->pos + 1 < rawSeqStore->size) {
                    seq[1].litLength += seq[0].matchLength;
                }
                rawSeqStore->pos++;
            }
            return;
        }
        srcSize -= seq->matchLength;
        seq->matchLength = 0;
        rawSeqStore->pos++;
    }
}